

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

CTcCodeLabel * __thiscall CTcCodeStream::new_label_here(CTcCodeStream *this)

{
  CTcCodeLabel *pCVar1;
  long in_RDI;
  CTcCodeStream *unaff_retaddr;
  CTcCodeLabel *lbl;
  
  pCVar1 = alloc_label(unaff_retaddr);
  pCVar1->ofs = *(ulong *)(in_RDI + 8);
  pCVar1->field_0x18 = pCVar1->field_0x18 & 0xfe | 1;
  return pCVar1;
}

Assistant:

CTcCodeLabel *CTcCodeStream::new_label_here()
{
    CTcCodeLabel *lbl;
    
    /* allocate a new label */
    lbl = alloc_label();

    /* set the label's location to the current write position */
    lbl->ofs = ofs_;
    lbl->is_known = TRUE;

    /* return the new label */
    return lbl;
}